

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

void __thiscall
TPZVec<TPZEqnArray<long_double>_>::Resize(TPZVec<TPZEqnArray<long_double>_> *this,int64_t newsize)

{
  undefined8 *puVar1;
  undefined1 auVar2 [16];
  ostream *poVar3;
  void *pvVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  TPZEqnArray<long_double> *pTVar8;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize: ",0x27);
    poVar3 = std::ostream::_M_insert<long>((long)&std::cerr);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::ostream::flush();
  }
  if (this->fNElements != newsize) {
    if (newsize == 0) {
      this->fNElements = 0;
      this->fNAlloc = 0;
      pTVar8 = this->fStore;
      if (pTVar8 != (TPZEqnArray<long_double> *)0x0) {
        lVar5 = *(long *)&pTVar8[-1].field_0x51d8;
        if (lVar5 != 0) {
          lVar6 = lVar5 * 0x51e0;
          do {
            TPZEqnArray<long_double>::~TPZEqnArray
                      ((TPZEqnArray<long_double> *)
                       ((long)pTVar8[-1].fEqStart.super_TPZManVector<int,_100>.fExtAlloc +
                       lVar6 + -0x28));
            lVar6 = lVar6 + -0x51e0;
          } while (lVar6 != 0);
        }
        operator_delete__(&pTVar8[-1].fLastTerm,lVar5 * 0x51e0 | 0x10);
      }
      this->fStore = (TPZEqnArray<long_double> *)0x0;
    }
    else {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = newsize;
      uVar7 = 0xffffffffffffffff;
      if (SUB168(auVar2 * ZEXT816(0x51e0),8) == 0) {
        uVar7 = SUB168(auVar2 * ZEXT816(0x51e0),0) | 0x10;
      }
      pvVar4 = operator_new__(uVar7);
      *(int64_t *)((long)pvVar4 + 8) = newsize;
      lVar5 = 0;
      pTVar8 = (TPZEqnArray<long_double> *)((long)pvVar4 + 0x10);
      do {
        TPZEqnArray<long_double>::TPZEqnArray(pTVar8);
        lVar5 = lVar5 + -0x51e0;
        pTVar8 = pTVar8 + 1;
      } while (newsize * -0x51e0 - lVar5 != 0);
      lVar5 = this->fNElements;
      if (newsize <= lVar5) {
        lVar5 = newsize;
      }
      if (0 < lVar5) {
        lVar6 = 0;
        do {
          pTVar8 = this->fStore;
          puVar1 = (undefined8 *)
                   ((long)(pTVar8->fEqStart).super_TPZManVector<int,_100>.fExtAlloc + lVar6 + -0x28)
          ;
          *(undefined8 *)((long)pvVar4 + lVar6 + 0x10) = *puVar1;
          TPZManVector<int,_100>::operator=
                    ((TPZManVector<int,_100> *)((long)pvVar4 + lVar6 + 0x18),
                     (TPZManVector<int,_100> *)(puVar1 + 1));
          TPZManVector<int,_100>::operator=
                    ((TPZManVector<int,_100> *)((long)pvVar4 + lVar6 + 0x1c8),
                     (TPZManVector<int,_100> *)
                     ((long)(pTVar8->fEqNumber).super_TPZManVector<int,_100>.fExtAlloc +
                     lVar6 + -0x20));
          TPZManVector<long_double,_1000>::operator=
                    ((TPZManVector<long_double,_1000> *)((long)pvVar4 + lVar6 + 0x380),
                     (TPZManVector<long_double,_1000> *)
                     ((long)(pTVar8->fEqValues).super_TPZManVector<long_double,_1000>.fExtAlloc +
                     lVar6 + -0x20));
          TPZManVector<int,_1000>::operator=
                    ((TPZManVector<int,_1000> *)((long)pvVar4 + lVar6 + 0x4220),
                     (TPZManVector<int,_1000> *)
                     ((long)(pTVar8->fIndex).super_TPZManVector<int,_1000>.fExtAlloc + lVar6 + -0x20
                     ));
          *(undefined4 *)((long)pvVar4 + lVar6 + 0x51e0) =
               *(undefined4 *)((long)&pTVar8->fLastTerm + lVar6);
          lVar6 = lVar6 + 0x51e0;
          lVar5 = lVar5 + -1;
        } while (lVar5 != 0);
      }
      pTVar8 = this->fStore;
      if (pTVar8 != (TPZEqnArray<long_double> *)0x0) {
        lVar5 = *(long *)&pTVar8[-1].field_0x51d8;
        if (lVar5 != 0) {
          lVar6 = lVar5 * 0x51e0;
          do {
            TPZEqnArray<long_double>::~TPZEqnArray
                      ((TPZEqnArray<long_double> *)
                       ((long)pTVar8[-1].fEqStart.super_TPZManVector<int,_100>.fExtAlloc +
                       lVar6 + -0x28));
            lVar6 = lVar6 + -0x51e0;
          } while (lVar6 != 0);
        }
        operator_delete__(&pTVar8[-1].fLastTerm,lVar5 * 0x51e0 | 0x10);
      }
      this->fStore = (TPZEqnArray<long_double> *)((long)pvVar4 + 0x10);
      this->fNElements = newsize;
      this->fNAlloc = newsize;
    }
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    //	int64_t nlongsize = 2147483647;
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
	}
#ifdef WIN32
	// Parece que o limite no windows é
	int sz = sizeof(T);
	int64_t nlongsize = 1704792168;
	if((newsize+1) > (1./sz)*nlongsize) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		std::cout << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
        //		DebugStop();
        //		return;
	}
#endif
#endif
	
	if(newsize == fNElements) return;
	if (newsize == 0) {
		fNElements = 0;
        fNAlloc = 0;
		delete[] fStore;
		fStore = nullptr;
		return;
	}
	T *newstore = new T[newsize];
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	if(fStore) delete[] fStore;
	fStore = newstore;
	fNElements = newsize;
    fNAlloc = newsize;
}